

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Atom_p __thiscall indigox::Molecule::GetAtomIndex(Molecule *this,uid_t i)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  element_type *this_00;
  int iVar4;
  Atom *__tmp;
  uid_t uVar5;
  element_type *peVar6;
  ulong in_RDX;
  ulong uVar7;
  Molecule *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  Molecule *extraout_RDX_00;
  Molecule *extraout_RDX_01;
  long lVar9;
  Atom *this_01;
  long *plVar10;
  long *plVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R12;
  __hash_code __code;
  undefined8 *puVar12;
  bool bVar13;
  bool bVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>,_false,_false>,_bool>
  pVar15;
  Atom_p AVar16;
  Atom_p a;
  CountableObject<indigox::Molecule> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  uid_t local_38;
  
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  uVar7 = in_RDX % *(ulong *)(i + 0x78);
  plVar10 = *(long **)(*(long *)(i + 0x70) + uVar7 * 8);
  plVar11 = (long *)0x0;
  if ((plVar10 != (long *)0x0) &&
     (plVar2 = (long *)*plVar10, plVar11 = plVar10, ((long *)*plVar10)[1] != in_RDX)) {
    while (plVar10 = plVar2, plVar2 = (long *)*plVar10, plVar2 != (long *)0x0) {
      plVar11 = (long *)0x0;
      if (((ulong)plVar2[1] % *(ulong *)(i + 0x78) != uVar7) ||
         (plVar11 = plVar10, plVar2[1] == in_RDX)) goto LAB_0010a8e7;
    }
    plVar11 = (long *)0x0;
  }
LAB_0010a8e7:
  if (plVar11 == (long *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = *plVar11;
  }
  bVar13 = true;
  if (((lVar9 == 0) ||
      (unaff_R12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x18),
      unaff_R12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
     (unaff_R12->_M_use_count == 0)) {
    bVar14 = false;
  }
  else {
    if (unaff_R12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = unaff_R12->_M_use_count;
      do {
        if (iVar4 == 0) {
          unaff_R12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = unaff_R12->_M_use_count;
        bVar13 = iVar4 == iVar1;
        if (bVar13) {
          unaff_R12->_M_use_count = iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar13);
    }
    if (unaff_R12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar13 = true;
    }
    else {
      bVar13 = unaff_R12->_M_use_count == 0;
    }
    if (bVar13) {
      this_01 = (Atom *)0x0;
    }
    else {
      this_01 = *(Atom **)(lVar9 + 0x10);
    }
    uVar5 = Atom::GetIndex(this_01);
    bVar14 = uVar5 == in_RDX;
    bVar13 = false;
  }
  if ((!bVar13) && (unaff_R12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R12);
  }
  if (bVar14) {
    peVar6 = *(element_type **)(lVar9 + 0x18);
    if (peVar6 != (element_type *)0x0) {
      iVar4 = *(int *)&(peVar6->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                       super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      do {
        if (iVar4 == 0) {
          peVar6 = (element_type *)0x0;
          break;
        }
        LOCK();
        iVar1 = *(int *)&(peVar6->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                         super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar13 = iVar4 == iVar1;
        if (bVar13) {
          *(int *)&(peVar6->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                   super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar13);
    }
    if (peVar6 == (element_type *)0x0) {
      bVar13 = true;
    }
    else {
      bVar13 = *(int *)&(peVar6->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                        super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0;
    }
    if (bVar13) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(uid_t *)(lVar9 + 0x10);
    }
    (this->super_CountableObject<indigox::Molecule>).id_ = uVar5;
    this_00 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
              super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
    super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
  }
  else {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(i + 0x70));
    puVar12 = *(undefined8 **)(i + 0x40);
    puVar3 = *(undefined8 **)(i + 0x48);
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (puVar12 != puVar3) {
      do {
        local_48.id_ = *puVar12;
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[1];
        if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
          }
        }
        uVar5 = Atom::GetIndex(local_48.id_);
        if (uVar5 == in_RDX) {
          (this->super_CountableObject<indigox::Molecule>).id_ = local_48.id_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<indigox::Molecule>,&local_40);
        }
        local_38 = Atom::GetIndex(local_48.id_);
        pVar15 = std::
                 _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Atom>&>
                           ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)(i + 0x70),&local_38,&local_48);
        _Var8._M_pi = pVar15._8_8_;
        if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
          _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
        }
        puVar12 = puVar12 + 2;
      } while (puVar12 != puVar3);
    }
  }
  AVar16.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  AVar16.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Atom_p)AVar16.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::GetAtomIndex(uid_t i) {
  Atom_p atm = Atom_p();
  auto it = idx_to_atom_.find(i);
  if (it != idx_to_atom_.end() && !(it->second.expired())
      && it->second.lock()->GetIndex() == i) {
    atm = it->second.lock();
  } else {
    idx_to_atom_.clear();
    for (Atom_p a : atoms_) {
      if (a->GetIndex() == i) atm = a;
      idx_to_atom_.emplace(a->GetIndex(), a);
    }
  }
  return atm;
}